

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O1

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<13,_11,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  undefined8 *puVar1;
  long lVar2;
  Matrix<float,_2,_4> *pMVar3;
  undefined4 *puVar4;
  Matrix<float,_2,_4> *pMVar5;
  bool bVar6;
  undefined4 uVar7;
  Vector<float,_3> res;
  Type in0;
  float afStack_98 [6];
  float local_80 [6];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  int local_48 [6];
  Matrix<float,_2,_4> local_30;
  
  puVar1 = &local_68;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    pMVar3 = (Matrix<float,_2,_4> *)0x0;
    do {
      pMVar5 = (Matrix<float,_2,_4> *)0x0;
      do {
        uVar7 = 0x3f800000;
        if (pMVar3 != pMVar5) {
          uVar7 = 0;
        }
        *(undefined4 *)(puVar1 + (long)pMVar5) = uVar7;
        pMVar5 = (Matrix<float,_2,_4> *)((long)(pMVar5->m_data).m_data[0].m_data + 1);
      } while (pMVar5 != (Matrix<float,_2,_4> *)&DAT_00000004);
      pMVar5 = (Matrix<float,_2,_4> *)((long)(pMVar3->m_data).m_data[0].m_data + 1);
      puVar1 = (undefined8 *)((long)puVar1 + 4);
      bVar6 = pMVar3 == (Matrix<float,_2,_4> *)0x0;
      pMVar3 = pMVar5;
    } while (bVar6);
    local_68 = *(undefined8 *)evalCtx->in[0].m_data;
    uStack_60 = *(undefined8 *)evalCtx->in[1].m_data;
    local_58 = *(undefined8 *)evalCtx->in[2].m_data;
    uStack_50 = *(undefined8 *)evalCtx->in[3].m_data;
  }
  else {
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    puVar4 = &s_constInMat4x2;
    pMVar3 = (Matrix<float,_2,_4> *)0x0;
    do {
      lVar2 = 0;
      do {
        *(undefined4 *)(puVar1 + lVar2) = puVar4[lVar2];
        lVar2 = lVar2 + 1;
      } while (lVar2 != 4);
      pMVar5 = (Matrix<float,_2,_4> *)((long)(pMVar3->m_data).m_data[0].m_data + 1);
      puVar1 = (undefined8 *)((long)puVar1 + 4);
      puVar4 = puVar4 + 4;
      bVar6 = pMVar3 == (Matrix<float,_2,_4> *)0x0;
      pMVar3 = pMVar5;
    } while (bVar6);
  }
  local_80[3] = (float)local_68 + local_68._4_4_ + (float)uStack_50;
  local_80[4] = (float)uStack_60 + uStack_60._4_4_ + uStack_50._4_4_;
  local_80[5] = (float)local_58 + local_58._4_4_;
  increment<float,2,4>(&local_30,(MatrixCaseUtils *)&local_68,pMVar5);
  local_80[0] = local_30.m_data.m_data[0].m_data[0] + local_30.m_data.m_data[0].m_data[1] +
                local_30.m_data.m_data[3].m_data[0];
  local_80[1] = local_30.m_data.m_data[1].m_data[0] + local_30.m_data.m_data[1].m_data[1] +
                local_30.m_data.m_data[3].m_data[1];
  local_80[2] = local_30.m_data.m_data[2].m_data[0] + local_30.m_data.m_data[2].m_data[1];
  afStack_98[2] = 0.0;
  afStack_98[3] = 0.0;
  afStack_98[4] = 0.0;
  lVar2 = 0;
  do {
    afStack_98[lVar2 + 2] = local_80[lVar2 + 3] + local_80[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_48[2] = 0;
  local_48[3] = 1;
  local_48[4] = 2;
  lVar2 = 2;
  do {
    (evalCtx->color).m_data[local_48[lVar2]] = afStack_98[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);

		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(in0) + reduceToVec3(increment(in0));
	}